

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

Value * __thiscall minja::CallExpr::do_evaluate(CallExpr *this,shared_ptr<minja::Context> *context)

{
  bool bVar1;
  runtime_error *prVar2;
  long in_RSI;
  Value *in_RDI;
  ArgumentsValue vargs;
  bool in_stack_00000093;
  int in_stack_00000094;
  Value *in_stack_00000098;
  Value obj;
  shared_ptr<minja::Context> *in_stack_000001c0;
  ArgumentsExpression *in_stack_000001c8;
  Value *in_stack_fffffffffffffef0;
  Value *__lhs;
  ArgumentsValue *in_stack_ffffffffffffff58;
  shared_ptr<minja::Context> *in_stack_ffffffffffffff60;
  Value *in_stack_ffffffffffffff68;
  
  __lhs = in_RDI;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x20));
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"CallExpr.object is null");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x30a842);
  Expression::evaluate
            ((Expression *)
             obj.callable_.
             super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi,
             (shared_ptr<minja::Context> *)
             obj.callable_.
             super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  bVar1 = Value::is_callable((Value *)0x30a867);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    Value::dump_abi_cxx11_(in_stack_00000098,in_stack_00000094,in_stack_00000093);
    std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffef0);
    std::runtime_error::runtime_error(prVar2,(string *)&stack0xffffffffffffff68);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ArgumentsExpression::evaluate(in_stack_000001c8,in_stack_000001c0);
  Value::call(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  ArgumentsValue::~ArgumentsValue((ArgumentsValue *)in_stack_fffffffffffffef0);
  Value::~Value(in_stack_fffffffffffffef0);
  return in_RDI;
}

Assistant:

Value do_evaluate(const std::shared_ptr<Context> & context) const override {
        if (!object) throw std::runtime_error("CallExpr.object is null");
        auto obj = object->evaluate(context);
        if (!obj.is_callable()) {
          throw std::runtime_error("Object is not callable: " + obj.dump(2));
        }
        auto vargs = args.evaluate(context);
        return obj.call(context, vargs);
    }